

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

int __thiscall asl::Random::init(Random *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  byte bVar2;
  undefined4 local_24;
  ulong uStack_20;
  int i;
  ULong s;
  bool fast_local;
  Random *this_local;
  
  if (((ulong)ctx & 1) == 0) {
    getBytes(this,0x20);
    iVar1 = extraout_EAX_00;
  }
  else {
    uStack_20 = inow();
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      bVar2 = (byte)local_24;
      uStack_20 = (uStack_20 & 0xffL << (bVar2 & 0x3f) ^ 0xffL << (bVar2 & 0x3f)) <<
                  ((bVar2 * -2 + '\a') * '\b' & 0x3f) ^ uStack_20;
    }
    seed(this,uStack_20);
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

void Random::init(bool fast)
{
	if (fast)
	{
		ULong s = (ULong)inow();
		for (int i = 0; i < (int)sizeof(s)/2; i++)
			s ^= ((s & (255ull << i)) ^ (255ull << i)) << 8 * (sizeof(s) - i - i - 1);
		seed(s);
	}
	else
		getBytes(_state, sizeof(_state));
}